

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_cte.cpp
# Opt level: O3

void __thiscall
duckdb::Transformer::TransformCTE
          (Transformer *this,PGWithClause *de_with_clause,CommonTableExpressionMap *cte_map)

{
  pointer *pppCVar1;
  int iVar2;
  iterator __position;
  PGList *list;
  __buckets_ptr pp_Var3;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var4;
  CommonTableExpressionInfo *__ptr_00;
  _Head_base<0UL,_duckdb::CommonTableExpressionInfo_*,_false> _Var5;
  undefined8 uVar6;
  __node_base this_00;
  undefined8 info;
  PGListCell *pPVar7;
  pointer pCVar8;
  iterator iVar9;
  default_delete<duckdb::CommonTableExpressionInfo> *this_01;
  NotImplementedException *pNVar10;
  ParserException *this_02;
  CTEMaterialize CVar11;
  undefined8 *puVar12;
  pointer *__ptr;
  string cte_name;
  _Head_base<0UL,_duckdb::CommonTableExpressionInfo_*,_false> local_168;
  PGWithClause *local_160;
  undefined1 local_158 [32];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_138;
  __node_base local_130;
  PGListCell *local_128;
  undefined1 local_120 [208];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __position._M_current =
       (this->stored_cte_map).
       super_vector<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
       .
       super__Vector_base<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_160 = de_with_clause;
  local_120._0_8_ = cte_map;
  if (__position._M_current ==
      (this->stored_cte_map).
      super_vector<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
      .
      super__Vector_base<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::
    vector<duckdb::CommonTableExpressionMap*,std::allocator<duckdb::CommonTableExpressionMap*>>::
    _M_realloc_insert<duckdb::CommonTableExpressionMap*>
              ((vector<duckdb::CommonTableExpressionMap*,std::allocator<duckdb::CommonTableExpressionMap*>>
                *)&this->stored_cte_map,__position,(CommonTableExpressionMap **)local_120);
  }
  else {
    *__position._M_current = cte_map;
    pppCVar1 = &(this->stored_cte_map).
                super_vector<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
                .
                super__Vector_base<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  pPVar7 = local_160->ctes->head;
  if (pPVar7 != (PGListCell *)0x0) {
    local_138 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&(cte_map->map).map_idx;
    local_130._M_nxt = (_Hash_node_base *)cte_map;
    do {
      local_168._M_head_impl = (CommonTableExpressionInfo *)operator_new(0x40);
      ((local_168._M_head_impl)->query).
      super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
      super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
      .super__Head_base<0UL,_duckdb::SelectStatement_*,_false> =
           (_Head_base<0UL,_duckdb::SelectStatement_*,_false>)0x0;
      *(undefined8 *)&(local_168._M_head_impl)->materialized = 0;
      ((local_168._M_head_impl)->aliases).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ((local_168._M_head_impl)->aliases).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ((local_168._M_head_impl)->aliases).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ((local_168._M_head_impl)->key_targets).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ((local_168._M_head_impl)->key_targets).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ((local_168._M_head_impl)->key_targets).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_168._M_head_impl)->materialized = CTE_MATERIALIZE_DEFAULT;
      local_120._0_8_ = (pPVar7->data).ptr_value;
      local_128 = pPVar7;
      optional_ptr<duckdb_libpgquery::PGCommonTableExpr,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGCommonTableExpr,_true> *)local_120);
      info = local_120._0_8_;
      list = (PGList *)((__node_base *)(local_120._0_8_ + 0x30))->_M_nxt;
      if ((list->head->data).ptr_value != (void *)0x0) {
        pCVar8 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                               *)&local_168);
        TransformExpressionList(this,list,&pCVar8->key_targets);
      }
      if (*(idx_t *)(info + 0x10) != 0) {
        for (puVar12 = *(undefined8 **)(*(idx_t *)(info + 0x10) + 8); puVar12 != (undefined8 *)0x0;
            puVar12 = (undefined8 *)puVar12[1]) {
          local_120._0_8_ = *puVar12;
          pCVar8 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                   ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                                 *)&local_168);
          optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                    ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_120);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pCVar8,
                     (char **)(local_120._0_8_ + 8));
        }
      }
      this_00._M_nxt = local_130._M_nxt;
      if (*(long *)(info + 0x40) != 0) {
        pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_120._0_8_ = local_120 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_120,"Column name setting not supported in CTEs","");
        NotImplementedException::NotImplementedException(pNVar10,(string *)local_120);
        __cxa_throw(pNVar10,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      if (*(__node_base_ptr *)(info + 0x48) != (__node_base_ptr)0x0) {
        pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_120._0_8_ = local_120 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_120,"Column type setting not supported in CTEs","");
        NotImplementedException::NotImplementedException(pNVar10,(string *)local_120);
        __cxa_throw(pNVar10,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      if (*(__node_base_ptr *)(info + 0x50) != (__node_base_ptr)0x0) {
        pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_120._0_8_ = local_120 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_120,"Column type modification not supported in CTEs","");
        NotImplementedException::NotImplementedException(pNVar10,(string *)local_120);
        __cxa_throw(pNVar10,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      if ((((case_insensitive_map_t<duckdb_libpgquery::PGWindowDef_*> *)(info + 0x58))->_M_h).
          _M_buckets != (__buckets_ptr)0x0) {
        pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_120._0_8_ = local_120 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_120,"CTE collations not supported","");
        NotImplementedException::NotImplementedException(pNVar10,(string *)local_120);
        __cxa_throw(pNVar10,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pp_Var3 = (((case_insensitive_map_t<idx_t> *)(info + 0x20))->_M_h)._M_buckets;
      if ((pp_Var3 == (__buckets_ptr)0x0) || (*(int *)pp_Var3 != 0xe9)) {
        pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_120._0_8_ = local_120 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_120,"A CTE needs a SELECT","");
        NotImplementedException::NotImplementedException(pNVar10,(string *)local_120);
        __cxa_throw(pNVar10,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      if ((*(char *)((long)&((__node_base *)(info + 0x28))->_M_nxt + 4) == '\0') &&
         (local_160->recursive != true)) {
        Transformer((Transformer *)local_120,this);
        TransformSelectStmt((Transformer *)local_158,(PGNode *)local_120,
                            SUB81((((case_insensitive_map_t<idx_t> *)(info + 0x20))->_M_h).
                                  _M_buckets,0));
        pCVar8 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                               *)&local_168);
        uVar6 = local_158._0_8_;
        local_158._0_8_ = (Transformer *)0x0;
        _Var4._M_head_impl =
             (pCVar8->query).
             super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
             .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
        (pCVar8->query).
        super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
        .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
             (SelectStatement *)uVar6;
        if (_Var4._M_head_impl != (SelectStatement *)0x0) {
          (**(code **)(*(long *)&(_Var4._M_head_impl)->super_SQLStatement + 8))();
          if ((Transformer *)local_158._0_8_ != (Transformer *)0x0) {
            (**(code **)(*(long *)local_158._0_8_ + 8))();
          }
        }
        ~Transformer((Transformer *)local_120);
      }
      else {
        unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
        ::operator*((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                     *)&local_168);
        TransformRecursiveCTE
                  ((Transformer *)local_120,(PGCommonTableExpr *)this,
                   (CommonTableExpressionInfo *)info);
        pCVar8 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                               *)&local_168);
        uVar6 = local_120._0_8_;
        local_120._0_8_ = (Transformer *)0x0;
        _Var4._M_head_impl =
             (pCVar8->query).
             super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
             .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
        (pCVar8->query).
        super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
        .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
             (SelectStatement *)uVar6;
        if (_Var4._M_head_impl != (SelectStatement *)0x0) {
          (**(code **)(*(long *)&(_Var4._M_head_impl)->super_SQLStatement + 8))();
          if ((Transformer *)local_120._0_8_ != (Transformer *)0x0) {
            (**(code **)(*(long *)local_120._0_8_ + 8))();
          }
        }
      }
      ::std::__cxx11::string::string
                ((string *)local_120,&(*(ParserOptions **)(info + 8))->preserve_identifier_case,
                 (allocator *)local_158);
      iVar9 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(local_138,(key_type *)local_120);
      if ((iVar9.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
           ._M_cur != (__node_type *)0x0) &&
         ((((VECTOR_TYPE *)&(this_00._M_nxt)->_M_nxt)->
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
          ).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start +
          *(long *)((long)iVar9.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                          ._M_cur + 0x28) != *(pointer *)(this_00._M_nxt + 1))) {
        this_02 = (ParserException *)__cxa_allocate_exception(0x10);
        local_158._0_8_ = local_158 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_158,"Duplicate CTE name \"%s\"","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_120._0_8_,(bool *)local_120._8_8_ + local_120._0_8_);
        ParserException::ParserException<std::__cxx11::string>
                  (this_02,(string *)local_158,&local_50);
        __cxa_throw(this_02,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar2 = *(int *)&(((case_insensitive_map_t<idx_t> *)(info + 0x18))->_M_h)._M_buckets;
      if (iVar2 == 2) {
        pCVar8 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                               *)&local_168);
        CVar11 = CTE_MATERIALIZE_NEVER;
LAB_007853f3:
        pCVar8->materialized = CVar11;
      }
      else {
        if (iVar2 == 1) {
          pCVar8 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                   ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                                 *)&local_168);
          CVar11 = CTE_MATERIALIZE_ALWAYS;
          goto LAB_007853f3;
        }
        if (iVar2 == 0) {
          pCVar8 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                   ::operator->((unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                                 *)&local_168);
          CVar11 = CTE_MATERIALIZE_DEFAULT;
          goto LAB_007853f3;
        }
      }
      this_01 = (default_delete<duckdb::CommonTableExpressionInfo> *)
                InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
                ::operator[]((InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>
                              *)this_00._M_nxt,(string *)local_120);
      _Var5._M_head_impl = local_168._M_head_impl;
      local_168._M_head_impl = (CommonTableExpressionInfo *)0x0;
      __ptr_00 = *(CommonTableExpressionInfo **)this_01;
      *(CommonTableExpressionInfo **)this_01 = _Var5._M_head_impl;
      if (__ptr_00 != (CommonTableExpressionInfo *)0x0) {
        ::std::default_delete<duckdb::CommonTableExpressionInfo>::operator()(this_01,__ptr_00);
      }
      if ((Transformer *)local_120._0_8_ != (Transformer *)(local_120 + 0x10)) {
        operator_delete((void *)local_120._0_8_);
      }
      if (local_168._M_head_impl != (CommonTableExpressionInfo *)0x0) {
        ::std::default_delete<duckdb::CommonTableExpressionInfo>::operator()
                  ((default_delete<duckdb::CommonTableExpressionInfo> *)&local_168,
                   local_168._M_head_impl);
      }
      pPVar7 = local_128->next;
    } while (pPVar7 != (PGListCell *)0x0);
  }
  return;
}

Assistant:

void Transformer::TransformCTE(duckdb_libpgquery::PGWithClause &de_with_clause, CommonTableExpressionMap &cte_map) {
	stored_cte_map.push_back(&cte_map);

	// TODO: might need to update in case of future lawsuit
	D_ASSERT(de_with_clause.ctes);
	for (auto cte_ele = de_with_clause.ctes->head; cte_ele != nullptr; cte_ele = cte_ele->next) {
		auto info = make_uniq<CommonTableExpressionInfo>();

		auto &cte = *PGPointerCast<duckdb_libpgquery::PGCommonTableExpr>(cte_ele->data.ptr_value);

		auto key_target = PGPointerCast<duckdb_libpgquery::PGNode>(cte.recursive_keys->head->data.ptr_value);
		if (key_target) {
			TransformExpressionList(*cte.recursive_keys, info->key_targets);
		}

		if (cte.aliascolnames) {
			for (auto node = cte.aliascolnames->head; node != nullptr; node = node->next) {
				auto value = PGPointerCast<duckdb_libpgquery::PGValue>(node->data.ptr_value);
				info->aliases.emplace_back(value->val.str);
			}
		}
		// lets throw some errors on unsupported features early
		if (cte.ctecolnames) {
			throw NotImplementedException("Column name setting not supported in CTEs");
		}
		if (cte.ctecoltypes) {
			throw NotImplementedException("Column type setting not supported in CTEs");
		}
		if (cte.ctecoltypmods) {
			throw NotImplementedException("Column type modification not supported in CTEs");
		}
		if (cte.ctecolcollations) {
			throw NotImplementedException("CTE collations not supported");
		}
		// we need a query
		if (!cte.ctequery || cte.ctequery->type != duckdb_libpgquery::T_PGSelectStmt) {
			throw NotImplementedException("A CTE needs a SELECT");
		}

		// CTE transformation can either result in inlining for non recursive CTEs, or in recursive CTE bindings
		// otherwise.
		if (cte.cterecursive || de_with_clause.recursive) {
			info->query = TransformRecursiveCTE(cte, *info);
		} else {
			Transformer cte_transformer(*this);
			info->query = cte_transformer.TransformSelectStmt(*cte.ctequery);
		}
		D_ASSERT(info->query);
		auto cte_name = string(cte.ctename);

		auto it = cte_map.map.find(cte_name);
		if (it != cte_map.map.end()) {
			// can't have two CTEs with same name
			throw ParserException("Duplicate CTE name \"%s\"", cte_name);
		}

		if (cte.ctematerialized == duckdb_libpgquery::PGCTEMaterializeDefault) {
#ifdef DUCKDB_ALTERNATIVE_VERIFY
			info->materialized = CTEMaterialize::CTE_MATERIALIZE_ALWAYS;
#else
			info->materialized = CTEMaterialize::CTE_MATERIALIZE_DEFAULT;
#endif
		} else if (cte.ctematerialized == duckdb_libpgquery::PGCTEMaterializeAlways) {
			info->materialized = CTEMaterialize::CTE_MATERIALIZE_ALWAYS;
		} else if (cte.ctematerialized == duckdb_libpgquery::PGCTEMaterializeNever) {
			info->materialized = CTEMaterialize::CTE_MATERIALIZE_NEVER;
		}

		cte_map.map[cte_name] = std::move(info);
	}
}